

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O3

void __thiscall leveldb::anon_unknown_3::DBIter::Next(DBIter *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  ulong extraout_RDX;
  
  if (this->valid_ == false) {
    __assert_fail("valid_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_iter.cc"
                  ,0x8e,"virtual void leveldb::(anonymous namespace)::DBIter::Next()");
  }
  if (this->direction_ == kReverse) {
    this->direction_ = kForward;
    iVar1 = (*this->iter_->_vptr_Iterator[2])();
    lVar2 = 0x18;
    if ((char)iVar1 != '\0') {
      lVar2 = 0x30;
    }
    (**(code **)((long)this->iter_->_vptr_Iterator + lVar2))();
  }
  else {
    iVar1 = (*this->iter_->_vptr_Iterator[8])();
    if (extraout_RDX < 8) {
      __assert_fail("internal_key.size() >= 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./db/dbformat.h"
                    ,0x60,"Slice leveldb::ExtractUserKey(const Slice &)");
    }
    std::__cxx11::string::_M_replace
              ((ulong)&this->saved_key_,0,(char *)(this->saved_key_)._M_string_length,
               CONCAT44(extraout_var,iVar1));
    (*this->iter_->_vptr_Iterator[6])();
  }
  iVar1 = (*this->iter_->_vptr_Iterator[2])();
  if ((char)iVar1 != '\0') {
    FindNextUserEntry(this,true,&this->saved_key_);
    return;
  }
  this->valid_ = false;
  (this->saved_key_)._M_string_length = 0;
  *(this->saved_key_)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void DBIter::Next() {
  assert(valid_);

  if (direction_ == kReverse) {  // Switch directions?
    direction_ = kForward;
    // iter_ is pointing just before the entries for this->key(),
    // so advance into the range of entries for this->key() and then
    // use the normal skipping code below.
    if (!iter_->Valid()) {
      iter_->SeekToFirst();
    } else {
      iter_->Next();
    }
    if (!iter_->Valid()) {
      valid_ = false;
      saved_key_.clear();
      return;
    }
    // saved_key_ already contains the key to skip past.
  } else {
    // Store in saved_key_ the current key so we skip it below.
    SaveKey(ExtractUserKey(iter_->key()), &saved_key_);

    // iter_ is pointing to current key. We can now safely move to the next to
    // avoid checking current key.
    iter_->Next();
    if (!iter_->Valid()) {
      valid_ = false;
      saved_key_.clear();
      return;
    }
  }

  FindNextUserEntry(true, &saved_key_);
}